

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::MaybeVariability
          (AsciiParser *this,Variability *variability,bool *varying_authored)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  string tok;
  string local_48;
  
  bVar2 = SkipWhitespace(this);
  if (bVar2) {
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    uVar1 = this->_sr->idx_;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    bVar2 = ReadIdentifier(this,&local_48);
    if (bVar2) {
      iVar3 = ::std::__cxx11::string::compare((char *)&local_48);
      if (iVar3 == 0) {
        *variability = Uniform;
        *varying_authored = false;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((char *)&local_48);
        if (iVar3 == 0) {
          *variability = Varying;
          *varying_authored = true;
        }
        else {
          *varying_authored = false;
          if (uVar1 <= this->_sr->length_) {
            this->_sr->idx_ = uVar1;
          }
        }
      }
      bVar2 = SkipWhitespace(this);
    }
    else {
      if (uVar1 <= this->_sr->length_) {
        this->_sr->idx_ = uVar1;
      }
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::MaybeVariability(tinyusdz::Variability *variability,
                                   bool *varying_authored) {
  if (!SkipWhitespace()) {
    return false;
  }

  std::string tok;

  auto loc = CurrLoc();
  if (!ReadIdentifier(&tok)) {
    SeekTo(loc);
    return false;
  }

  if (tok == "uniform") {
    (*variability) = tinyusdz::Variability::Uniform;
    (*varying_authored) = false;
  } else if (tok == "varying") {
    (*variability) = tinyusdz::Variability::Varying;
    (*varying_authored) = true;
  } else {
    (*varying_authored) = false;
    // rewind
    SeekTo(loc);
  }

  if (!SkipWhitespace()) {
    return false;
  }

  return true;
}